

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool MomentChi2Test(HashInfo *info)

{
  double dVar1;
  pfHash p_Var2;
  long lVar3;
  ulong uVar4;
  uint i;
  uint32_t uVar5;
  char *__s;
  longdouble lVar6;
  longdouble lVar7;
  unsigned_long l;
  unsigned_long h;
  uint k;
  ulong local_a8;
  uint local_9c;
  ulong local_98;
  int local_8c;
  undefined4 local_88;
  longdouble local_84;
  double local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  longdouble local_4c;
  longdouble local_40;
  longdouble local_34;
  
  p_Var2 = info->hash;
  if ((p_Var2 == sha1_32a || p_Var2 == md5_32) || (uVar4 = 3, 0x80 < info->hashbits)) {
    uVar4 = (ulong)((g_testExtra ^ 1) * 3 + 3);
  }
  local_88 = 0;
  (*p_Var2)(&local_88,4,0,&local_a8);
  printf("Running 1st unseeded MomentChi2 for the low 32bits/step %d ... ",uVar4);
  fflush((FILE *)0x0);
  local_9c = 1;
  lVar6 = (longdouble)0;
  local_40 = lVar6;
  do {
    local_84 = local_40;
    (*p_Var2)(&local_9c,4,0,&local_98);
    lVar3 = POPCOUNT(local_a8 ^ local_98);
    local_60 = lVar3 * lVar3 * lVar3 * lVar3 * lVar3;
    local_40 = (longdouble)local_60 + local_84;
    local_58 = local_60 * local_60;
    lVar6 = lVar6 + (longdouble)local_58;
    local_a8 = local_98;
    local_9c = local_9c + (int)uVar4;
  } while (local_9c < 0xfffffff1);
  local_8c = (int)(0xfffffff0 / uVar4);
  local_34 = (longdouble)local_8c;
  local_40 = local_40 / local_34;
  local_4c = (lVar6 / local_34 - local_40 * local_40) / local_34;
  printf("%Lf - %Lf\n");
  printf("Running 2nd   seeded MomentChi2 for the low 32bits/step %d ... ",uVar4);
  fflush((FILE *)0x0);
  (*p_Var2)(&local_88,4,0,&local_a8);
  lVar6 = (longdouble)0;
  uVar5 = 1;
  lVar7 = lVar6;
  do {
    local_84 = lVar6;
    (*p_Var2)(&local_88,4,uVar5,&local_98);
    lVar3 = POPCOUNT(local_a8 ^ local_98);
    local_70 = lVar3 * lVar3 * lVar3 * lVar3 * lVar3;
    lVar6 = (longdouble)local_70 + local_84;
    local_68 = local_70 * local_70;
    lVar7 = (longdouble)local_68 + lVar7;
    local_a8 = local_98;
    uVar5 = uVar5 + (int)uVar4;
  } while (uVar5 < 0xfffffff1);
  lVar6 = lVar6 / local_34;
  dVar1 = (double)(((local_40 - lVar6) * (local_40 - lVar6)) /
                  (local_4c + (lVar7 / local_34 - lVar6 * lVar6) / local_34));
  local_78 = dVar1;
  printf("%Lf - %Lf\nKeySeedMomentChi2:\t%g\t");
  fflush((FILE *)0x0);
  __s = "FAIL!!!!";
  if (dVar1 <= 3.84145882069413) {
    __s = "PASS";
  }
  puts(__s);
  fflush((FILE *)0x0);
  return dVar1 <= 3.84145882069413;
}

Assistant:

bool MomentChi2Test ( struct HashInfo *info )
{
  pfHash hash = info->hash;
  const int size = info->hashbits / 8;
  const int step = ((hash == md5_32 || hash == sha1_32a || info->hashbits > 128)
                    && !g_testExtra) ? 6 : 3;
  unsigned k = 0, s = 0;
  unsigned long l, h, x;
  const unsigned mx = 0xfffffff0;
  long double sa=0, saa=0, sb=0, sbb=0,	n = mx/step;
  hash(&k,sizeof(k),s,&l);
  printf("Running 1st unseeded MomentChi2 for the low 32bits/step %d ... ", step);
  fflush(NULL);
  for(unsigned i=1; i<=mx; i+=step){
    hash(&i,sizeof(i),s,&h);
    x = popcount8(l^h); // check the lower 32bits only
    x = x*x*x*x*x;
    sa+=x; saa+=x*x; l=h;
  }
  sa/=n; saa=(saa/n-sa*sa)/n;
  printf("%Lf - %Lf\n", sa, saa);
  printf("Running 2nd   seeded MomentChi2 for the low 32bits/step %d ... ", step);
  fflush(NULL);
  hash(&k,sizeof(k),s,&l);
  for(unsigned i=1; i<=mx; i+=step){
    hash(&k,sizeof(k),i,&h);
    x = popcount8(l^h);
    x = x*x*x*x*x;
    sb+=x; sbb+=x*x; l=h;
  }
  sb/=n; sbb=(sbb/n-sb*sb)/n;

  double chi2=(sa-sb)*(sa-sb)/(saa+sbb);
  printf("%Lf - %Lf\nKeySeedMomentChi2:\t%g\t", sb, sbb, chi2);
  fflush(NULL);
  if (chi2 > 3.84145882069413)
  {
    printf("FAIL!!!!\n");
    fflush(NULL);
    return false;
  }
  else
  {
    printf("PASS\n");
    fflush(NULL);
    return true;
  }
}